

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

ctemplate * __thiscall ctemplate::StringToTemplateFile(ctemplate *this,string *s)

{
  char *local_c8;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [55];
  allocator local_51;
  string local_50 [39];
  undefined1 local_29;
  char local_28 [8];
  char buf [16];
  string *s_local;
  string *filename;
  
  StringToTemplateFile::filenum = StringToTemplateFile::filenum + 1;
  buf._8_8_ = s;
  snprintf(local_28,0x10,"%03d");
  local_29 = 0;
  if (g_tmpdir == (char *)0x0) {
    local_c8 = "";
  }
  else {
    local_c8 = g_tmpdir;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_c8,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"template.",&local_a9);
  std::operator+(local_88,(char *)local_a8);
  ctemplate::PathJoin((string *)this,local_50);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  StringToFile((string *)buf._8_8_,(string *)this);
  return this;
}

Assistant:

string StringToTemplateFile(const string& s) {
  static int filenum = 0;
  char buf[16];
  snprintf(buf, sizeof(buf), "%03d", ++filenum);
  string filename = PathJoin(g_tmpdir ? g_tmpdir : "",
                             string("template.") + buf);
  StringToFile(s, filename);
  return filename;
}